

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::AtomicCompSwapCase::EndResultVerifier::operator()
          (EndResultVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  ostringstream *this_00;
  ostringstream *this_01;
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  long *plVar4;
  char *__s;
  undefined8 *puVar5;
  ulong uVar6;
  int iVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_type *psVar9;
  ConstPixelBufferAccess *__n;
  int iVar10;
  void *__buf;
  Vector<int,_3> (*arr) [5];
  int (*arr_00) [5];
  int z;
  int *piVar11;
  int iVar12;
  int i;
  long lVar13;
  int iVar14;
  int y;
  int z_00;
  IVec3 invocationGlobalIDs [5];
  int assignArgs [5];
  allocator<char> local_591;
  string local_590;
  string local_570;
  int local_54c;
  EndResultVerifier *local_548;
  long *local_540 [2];
  long local_530 [2];
  TestLog *local_520;
  long *local_518;
  int aiStack_510 [2];
  long local_508 [3];
  undefined4 uStack_4f0;
  undefined4 local_4ec;
  undefined4 uStack_4e8;
  undefined8 uStack_4e4;
  Functional local_4d8 [32];
  Vector<int,_2> local_4b8;
  undefined1 local_4b0 [112];
  ios_base local_440 [8];
  ios_base local_438 [264];
  undefined1 local_330 [8];
  _func_int **local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_320 [6];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  local_548 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
  std::ostream::operator<<((ostringstream *)local_4b0,sliceOrFaceNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
  std::ios_base::~ios_base(local_440);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_518,0,(char *)0x0,0x1c50118);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 == paVar8) {
    local_320[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_320[0]._8_8_ = plVar4[3];
    local_330 = (undefined1  [8])local_320;
  }
  else {
    local_320[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_330 = (undefined1  [8])*plVar4;
  }
  local_328 = (_func_int **)plVar4[1];
  *plVar4 = (long)paVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_548->m_imageType == TEXTURETYPE_CUBE) {
    __s = glu::getCubeMapFaceName
                    ((&DAT_01c4f134)
                     [(int)(&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces
                           )[sliceOrFaceNdx]]);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_540,__s,&local_591);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)local_540,0,(char *)0x0,0x1cb8076);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
    std::ostream::operator<<(local_4b0,sliceOrFaceNdx);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
    std::ios_base::~ios_base(local_440);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)local_540,0,(char *)0x0,0x1c4fc47);
  }
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  psVar9 = puVar5 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_590.field_2._M_allocated_capacity = *psVar9;
    local_590.field_2._8_8_ = puVar5[3];
  }
  else {
    local_590.field_2._M_allocated_capacity = *psVar9;
    local_590._M_dataplus._M_p = (pointer)*puVar5;
  }
  local_590._M_string_length = puVar5[1];
  *puVar5 = psVar9;
  puVar5[1] = 0;
  *(undefined1 *)psVar9 = 0;
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_590,0,(char *)0x0,0x1c50123);
  psVar9 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_570.field_2._M_allocated_capacity = *psVar9;
    local_570.field_2._8_8_ = plVar4[3];
    local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  }
  else {
    local_570.field_2._M_allocated_capacity = *psVar9;
    local_570._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_570._M_string_length = plVar4[1];
  *plVar4 = (long)psVar9;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  __n = resultSlice;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,(string *)local_330,&local_570,resultSlice,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1b0,(int)log,__buf,(size_t)__n);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if (local_540[0] != local_530) {
    operator_delete(local_540[0],local_530[0] + 1);
  }
  if (local_330 != (undefined1  [8])local_320) {
    operator_delete((void *)local_330,local_320[0]._M_allocated_capacity + 1);
  }
  if (local_518 != local_508) {
    operator_delete(local_518,local_508[0] + 1);
  }
  iVar14 = (resultSlice->m_size).m_data[1];
  if (0 < iVar14) {
    iVar3 = sliceOrFaceNdx * sliceOrFaceNdx;
    iVar7 = (resultSlice->m_size).m_data[0];
    z_00 = 0;
    local_54c = iVar3;
    local_520 = log;
    do {
      if (0 < iVar7) {
        iVar14 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_4b0,(int)resultSlice,iVar14,z_00);
          uVar2 = local_4b0._0_4_;
          uStack_4e8 = 0;
          uStack_4e4 = 0;
          local_508[2] = 0;
          uStack_4f0 = 0;
          local_4ec = 0;
          local_508[0] = 0;
          local_508[1] = 0;
          local_518 = (long *)0x0;
          aiStack_510[0] = 0;
          aiStack_510[1] = 0;
          iVar7 = (resultSlice->m_size).m_data[0];
          iVar1 = local_548->m_imageWidth;
          piVar11 = aiStack_510;
          lVar13 = 0;
          iVar12 = iVar14;
          do {
            piVar11[-2] = iVar12;
            piVar11[-1] = z_00;
            *piVar11 = sliceOrFaceNdx;
            iVar10 = (iVar1 + iVar12) % iVar1;
            *(int *)(local_4d8 + lVar13 * 4) =
                 ((iVar1 + iVar12) / iVar1) * 0x2a + iVar10 * iVar10 + z_00 * z_00 + iVar3;
            lVar13 = lVar13 + 1;
            iVar12 = iVar12 + iVar7;
            piVar11 = piVar11 + 3;
          } while (lVar13 != 5);
          uVar6 = 0;
          do {
            lVar13 = uVar6 * 4;
            if (3 < uVar6) break;
            uVar6 = uVar6 + 1;
          } while (uVar2 != *(ChannelOrder *)(local_4d8 + lVar13));
          if (uVar2 != *(ChannelOrder *)(local_4d8 + lVar13)) {
            local_330 = (undefined1  [8])local_520;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_328,"// Failure: invalid value at pixel ",0x23);
            local_4b8.m_data[0] = iVar14;
            local_4b8.m_data[1] = z_00;
            tcu::operator<<((ostream *)&local_328,&local_4b8);
            this_00 = (ostringstream *)(local_1b0 + 8);
            this_01 = (ostringstream *)(local_4b0 + 8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,": got ",6);
            std::ostream::operator<<((ostringstream *)&local_328,uVar2);
            local_1b0._0_8_ =
                 tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
            std::__cxx11::ostringstream::ostringstream(this_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,"// Note: relevant shader invocation global IDs are ",0x33
                      );
            arrayStr<tcu::Vector<int,3>,5>(&local_570,(Functional *)&local_518,arr);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_00,local_570._M_dataplus._M_p,local_570._M_string_length);
            local_4b0._0_8_ =
                 tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
            std::__cxx11::ostringstream::ostringstream(this_01);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_01,"// Note: expected one of ",0x19);
            arrayStr<int,5>(&local_590,local_4d8,arr_00);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_01,local_590._M_dataplus._M_p,local_590._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_01,
                       " (those are the values given as the \'data\' argument in the invocations that contribute to this pixel)"
                       ,0x65);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_590._M_dataplus._M_p != &local_590.field_2) {
              operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream(this_01);
            std::ios_base::~ios_base(local_438);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_570._M_dataplus._M_p != &local_570.field_2) {
              operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream(this_00);
            std::ios_base::~ios_base(local_138);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
            std::ios_base::~ios_base(local_2b8);
            return false;
          }
          iVar14 = iVar14 + 1;
        } while (iVar14 < iVar7);
        iVar14 = (resultSlice->m_size).m_data[1];
        iVar3 = local_54c;
      }
      z_00 = z_00 + 1;
    } while (z_00 < iVar14);
  }
  return true;
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		DE_ASSERT(isFormatTypeInteger(resultSlice.getFormat().type));
		DE_ASSERT(resultSlice.getWidth() == m_imageWidth);

		log << TestLog::Image("EndResults" + toString(sliceOrFaceNdx),
							  "Result Values, " + (m_imageType == TEXTURETYPE_CUBE ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
																				   : "slice " + toString(sliceOrFaceNdx)),
							  resultSlice);

		for (int y = 0; y < resultSlice.getHeight(); y++)
		for (int x = 0; x < resultSlice.getWidth(); x++)
		{
			// Compute the value-to-assign arguments that were given to the atomic function in the invocations that contribute to this pixel.
			// One of those should be the result.

			const int	result = resultSlice.getPixelInt(x, y).x();
			IVec3		invocationGlobalIDs[NUM_INVOCATIONS_PER_PIXEL];
			int			assignArgs[NUM_INVOCATIONS_PER_PIXEL];

			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				const IVec3 gid(x + i*resultSlice.getWidth(), y, sliceOrFaceNdx);

				invocationGlobalIDs[i]	= gid;
				assignArgs[i]			= getAssignArg(gid, m_imageWidth);
			}

			{
				bool matchFound = false;
				for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL && !matchFound; i++)
					matchFound = result == assignArgs[i];

				if (!matchFound)
				{
					log << TestLog::Message << "// Failure: invalid value at pixel " << IVec2(x, y) << ": got " << result << TestLog::EndMessage
						<< TestLog::Message << "// Note: relevant shader invocation global IDs are " << arrayStr(invocationGlobalIDs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: expected one of " << arrayStr(assignArgs)
											<< " (those are the values given as the 'data' argument in the invocations that contribute to this pixel)"
											<< TestLog::EndMessage;
					return false;
				}
			}
		}

		return true;
	}